

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O0

CSubNet * LookupSubNet(string *subnet_str)

{
  long lVar1;
  string_view str;
  string_view str_00;
  uint8_t mask;
  bool bVar2;
  size_type sVar3;
  CService *service;
  CSubNet *pCVar4;
  CNetAddr *in_RSI;
  CSubNet *in_RDI;
  long in_FS_OFFSET;
  __sv_type _Var5;
  size_t slash_pos;
  CSubNet *subnet;
  uint8_t netmask;
  optional<CNetAddr> full_netmask;
  string netmask_str;
  optional<CNetAddr> addr;
  string str_addr;
  undefined6 in_stack_fffffffffffffd58;
  uint16_t in_stack_fffffffffffffd5e;
  undefined7 in_stack_fffffffffffffd60;
  char in_stack_fffffffffffffd67;
  CSubNet *in_stack_fffffffffffffd68;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_stack_fffffffffffffd70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  undefined1 fAllowLookup;
  undefined7 in_stack_fffffffffffffda8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 uVar6;
  byte bVar7;
  CSubNet *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = 0;
  pCVar4 = in_RDI;
  this = in_RDI;
  CSubNet::CSubNet((CSubNet *)CONCAT26(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58));
  fAllowLookup = (undefined1)((ulong)pCVar4 >> 0x38);
  mask = CSubNet::IsValid((CSubNet *)CONCAT26(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58));
  if (((mask ^ 0xff) & 1) == 0) {
    __assert_fail("!subnet.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
                  ,0x2f7,"CSubNet LookupSubNet(const std::string &)");
  }
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd78);
  str_00._M_str._0_7_ = in_stack_fffffffffffffd88;
  str_00._M_len = (size_t)in_stack_fffffffffffffd80;
  str_00._M_str._7_1_ = in_stack_fffffffffffffd8f;
  bVar2 = util::ContainsNoNUL(str_00);
  if (bVar2) {
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_last_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffd68,in_stack_fffffffffffffd67,
                         CONCAT26(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78,
               (size_type)in_stack_fffffffffffffd70);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    LookupHost((string *)CONCAT17(mask,in_stack_fffffffffffffda8),(bool)fAllowLookup,
               (DNSLookupFn *)in_RDI);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::~function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                 *)CONCAT26(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58));
    bVar2 = std::optional<CNetAddr>::has_value
                      ((optional<CNetAddr> *)
                       CONCAT26(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58));
    if (bVar2) {
      service = (CService *)
                std::optional<CNetAddr>::value((optional<CNetAddr> *)in_stack_fffffffffffffd68);
      CService::CService((CService *)in_stack_fffffffffffffd68,
                         (CNetAddr *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                         in_stack_fffffffffffffd5e);
      MaybeFlipIPv6toCJDNS(service);
      CNetAddr::CNetAddr(&in_stack_fffffffffffffd68->network,
                         (CNetAddr *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
      std::optional<CNetAddr>::operator=
                ((optional<CNetAddr> *)in_stack_fffffffffffffd68,
                 (CNetAddr *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
      CNetAddr::~CNetAddr((CNetAddr *)CONCAT26(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58))
      ;
      CService::~CService((CService *)CONCAT26(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58))
      ;
      CService::~CService((CService *)CONCAT26(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58))
      ;
      if (sVar3 == 0xffffffffffffffff) {
        pCVar4 = (CSubNet *)
                 std::optional<CNetAddr>::value((optional<CNetAddr> *)in_stack_fffffffffffffd68);
        CSubNet::CSubNet((CSubNet *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
                         (CNetAddr *)in_stack_fffffffffffffd80);
        CSubNet::operator=(pCVar4,(CSubNet *)
                                  CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
        CSubNet::~CSubNet((CSubNet *)CONCAT26(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58));
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78,
                   (size_type)in_stack_fffffffffffffd70);
        _Var5 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd78);
        str._M_str = (char *)in_stack_fffffffffffffd78;
        str._M_len = (size_t)in_stack_fffffffffffffd70;
        bVar2 = ParseUInt8(str,(uint8_t *)
                               CONCAT26(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58));
        if (bVar2) {
          std::optional<CNetAddr>::value((optional<CNetAddr> *)in_stack_fffffffffffffd68);
          CSubNet::CSubNet((CSubNet *)_Var5._M_str,(CNetAddr *)_Var5._M_len,mask);
          CSubNet::operator=(in_stack_fffffffffffffd68,
                             (CSubNet *)
                             CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
          CSubNet::~CSubNet((CSubNet *)CONCAT26(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58)
                           );
        }
        else {
          std::
          function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
          ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                      *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
          LookupHost((string *)CONCAT17(mask,in_stack_fffffffffffffda8),(bool)fAllowLookup,
                     (DNSLookupFn *)in_RDI);
          std::
          function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
          ::~function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                       *)CONCAT26(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58));
          bVar2 = std::optional<CNetAddr>::has_value
                            ((optional<CNetAddr> *)
                             CONCAT26(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58));
          if (bVar2) {
            std::optional<CNetAddr>::value((optional<CNetAddr> *)in_stack_fffffffffffffd68);
            std::optional<CNetAddr>::value((optional<CNetAddr> *)in_stack_fffffffffffffd68);
            CSubNet::CSubNet(this,in_RSI,(CNetAddr *)CONCAT17(uVar6,in_stack_fffffffffffffdf0));
            CSubNet::operator=(in_stack_fffffffffffffd68,
                               (CSubNet *)
                               CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
            CSubNet::~CSubNet((CSubNet *)
                              CONCAT26(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58));
          }
          std::optional<CNetAddr>::~optional
                    ((optional<CNetAddr> *)
                     CONCAT26(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58));
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT26(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58));
      }
    }
    bVar7 = 1;
    std::optional<CNetAddr>::~optional
              ((optional<CNetAddr> *)CONCAT26(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58));
  }
  else {
    bVar7 = 1;
  }
  if ((bVar7 & 1) == 0) {
    CSubNet::~CSubNet((CSubNet *)CONCAT26(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

CSubNet LookupSubNet(const std::string& subnet_str)
{
    CSubNet subnet;
    assert(!subnet.IsValid());
    if (!ContainsNoNUL(subnet_str)) {
        return subnet;
    }

    const size_t slash_pos{subnet_str.find_last_of('/')};
    const std::string str_addr{subnet_str.substr(0, slash_pos)};
    std::optional<CNetAddr> addr{LookupHost(str_addr, /*fAllowLookup=*/false)};

    if (addr.has_value()) {
        addr = static_cast<CNetAddr>(MaybeFlipIPv6toCJDNS(CService{addr.value(), /*port=*/0}));
        if (slash_pos != subnet_str.npos) {
            const std::string netmask_str{subnet_str.substr(slash_pos + 1)};
            uint8_t netmask;
            if (ParseUInt8(netmask_str, &netmask)) {
                // Valid number; assume CIDR variable-length subnet masking.
                subnet = CSubNet{addr.value(), netmask};
            } else {
                // Invalid number; try full netmask syntax. Never allow lookup for netmask.
                const std::optional<CNetAddr> full_netmask{LookupHost(netmask_str, /*fAllowLookup=*/false)};
                if (full_netmask.has_value()) {
                    subnet = CSubNet{addr.value(), full_netmask.value()};
                }
            }
        } else {
            // Single IP subnet (<ipv4>/32 or <ipv6>/128).
            subnet = CSubNet{addr.value()};
        }
    }

    return subnet;
}